

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginMainMenuBar(void)

{
  undefined8 uVar1;
  float fVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiViewport *pIVar6;
  ImGuiWindow *pIVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ImVec2 menu_bar_pos;
  ImVec2 menu_bar_size;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  
  pIVar3 = GImGui;
  pIVar6 = GetMainViewport();
  pIVar7 = FindWindowByName("##MainMenuBar");
  auVar8 = ZEXT416((uint)((pIVar3->Style).DisplaySafeAreaPadding.y - (pIVar3->Style).FramePadding.y)
                  );
  auVar9 = vcmpss_avx(ZEXT816(0) << 0x40,auVar8,2);
  auVar9 = vandps_avx(auVar9,auVar8);
  (pIVar3->NextWindowData).MenuBarOffsetMinVal.x = (pIVar3->Style).DisplaySafeAreaPadding.x;
  (pIVar3->NextWindowData).MenuBarOffsetMinVal.y = auVar9._0_4_;
  if ((pIVar7 == (ImGuiWindow *)0x0) || (pIVar7->BeginCount == 0)) {
    uVar1 = *(undefined8 *)&pIVar6[4].Size.y;
    fVar2 = (float)uVar1;
    auVar9._0_4_ = (pIVar6->Pos).x + fVar2;
    auVar9._4_4_ = (pIVar6->Pos).y + (float)((ulong)uVar1 >> 0x20);
    auVar9._8_8_ = 0;
    local_38 = (ImVec2)vmovlps_avx(auVar9);
    local_28.x = ((pIVar6->Size).x - fVar2) + pIVar6[4].WorkPos.y;
    local_28.y = 1.0;
    local_30.x = 0.0;
    local_30.y = 0.0;
    SetNextWindowPos(&local_38,0,&local_30);
    SetNextWindowSize(&local_28,0);
  }
  PushStyleVar(2,0.0);
  local_38.x = 0.0;
  local_38.y = 0.0;
  PushStyleVar(4,&local_38);
  bVar5 = false;
  bVar4 = Begin("##MainMenuBar",(bool *)0x0,0x50f);
  if (bVar4) {
    bVar5 = BeginMenuBar();
  }
  PopStyleVar(2);
  pIVar7 = GImGui->CurrentWindow;
  pIVar7->WriteAccessed = true;
  if (pIVar7->BeginCount == 1) {
    pIVar6[4].WorkPos.x = (pIVar7->Size).y + pIVar6[4].WorkPos.x;
  }
  (pIVar3->NextWindowData).MenuBarOffsetMinVal.x = 0.0;
  (pIVar3->NextWindowData).MenuBarOffsetMinVal.y = 0.0;
  if (bVar5 == false) {
    End();
  }
  return bVar5;
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)GetMainViewport();
    ImGuiWindow* menu_bar_window = FindWindowByName("##MainMenuBar");

    // For the main menu bar, which cannot be moved, we honor g.Style.DisplaySafeAreaPadding to ensure text can be visible on a TV set.
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));

    // Get our rectangle at the top of the work area
    if (menu_bar_window == NULL || menu_bar_window->BeginCount == 0)
    {
        // Set window position
        // We don't attempt to calculate our height ahead, as it depends on the per-viewport font size. 
        // However menu-bar will affect the minimum window size so we'll get the right height.
        ImVec2 menu_bar_pos = viewport->Pos + viewport->CurrWorkOffsetMin;
        ImVec2 menu_bar_size = ImVec2(viewport->Size.x - viewport->CurrWorkOffsetMin.x + viewport->CurrWorkOffsetMax.x, 1.0f);
        SetNextWindowPos(menu_bar_pos);
        SetNextWindowSize(menu_bar_size);
    }

    // Create window
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0)); // Lift normal size constraint, however the presence of a menu-bar will give us the minimum height we want.
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    bool is_open = Begin("##MainMenuBar", NULL, window_flags) && BeginMenuBar();
    PopStyleVar(2);

    // Report our size into work area (for next frame) using actual window size
    menu_bar_window = GetCurrentWindow();
    if (menu_bar_window->BeginCount == 1)
        viewport->CurrWorkOffsetMin.y += menu_bar_window->Size.y;

    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    if (!is_open)
    {
        End();
        return false;
    }
    return true; //-V1020
}